

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access_log.c
# Opt level: O0

h2o_logger_t * h2o_access_log_register(h2o_pathconf_t *pathconf,h2o_access_log_filehandle_t *fh)

{
  h2o_logger_t *phVar1;
  st_h2o_access_logger_t *self;
  h2o_access_log_filehandle_t *fh_local;
  h2o_pathconf_t *pathconf_local;
  
  phVar1 = h2o_create_logger(pathconf,0x30);
  phVar1->dispose = dispose;
  phVar1->log_access = log_access;
  phVar1[1]._config_slot = (size_t)fh;
  h2o_mem_addref_shared(fh);
  return phVar1;
}

Assistant:

h2o_logger_t *h2o_access_log_register(h2o_pathconf_t *pathconf, h2o_access_log_filehandle_t *fh)
{
    struct st_h2o_access_logger_t *self = (void *)h2o_create_logger(pathconf, sizeof(*self));

    self->super.dispose = dispose;
    self->super.log_access = log_access;
    self->fh = fh;
    h2o_mem_addref_shared(fh);

    return &self->super;
}